

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void releaseAllSavepoints(Pager *pPager)

{
  sqlite3_file *psVar1;
  long lVar2;
  long lVar3;
  
  if (0 < pPager->nSavepoint) {
    lVar2 = 0x10;
    lVar3 = 0;
    do {
      sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar2 + -0x24));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x38;
    } while (lVar3 < pPager->nSavepoint);
  }
  if ((pPager->exclusiveMode == '\0') || (pPager->sjfd->pMethods == &MemJournalMethods)) {
    psVar1 = pPager->sjfd;
    if (psVar1->pMethods != (sqlite3_io_methods *)0x0) {
      (*psVar1->pMethods->xClose)(psVar1);
      psVar1->pMethods = (sqlite3_io_methods *)0x0;
    }
  }
  sqlite3_free(pPager->aSavepoint);
  pPager->aSavepoint = (PagerSavepoint *)0x0;
  pPager->nSavepoint = 0;
  pPager->nSubRec = 0;
  return;
}

Assistant:

static void releaseAllSavepoints(Pager *pPager){
  int ii;               /* Iterator for looping through Pager.aSavepoint */
  for(ii=0; ii<pPager->nSavepoint; ii++){
    sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
  }
  if( !pPager->exclusiveMode || sqlite3JournalIsInMemory(pPager->sjfd) ){
    sqlite3OsClose(pPager->sjfd);
  }
  sqlite3_free(pPager->aSavepoint);
  pPager->aSavepoint = 0;
  pPager->nSavepoint = 0;
  pPager->nSubRec = 0;
}